

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O3

Ptr __thiscall
TgBot::Api::sendAnimation
          (Api *this,int64_t chatId,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *animation,int32_t duration,int32_t width,int32_t height,
          variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *thumb,string *caption,int32_t replyToMessageId,Ptr *replyMarkup,string *parseMode,
          bool disableNotification)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  result_type pnVar6;
  result_type pnVar7;
  undefined4 in_register_0000000c;
  variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar8;
  undefined4 in_stack_0000001c;
  undefined7 in_stack_00000031;
  char in_stack_00000038;
  get_visitor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_2;
  bool local_91;
  int32_t local_90;
  int32_t local_8c;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_88;
  ptree local_68;
  string local_40;
  variant<std::shared_ptr<TgBot::InputFile>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  
  this_00 = (variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *)
            CONCAT44(in_register_0000000c,duration);
  local_91 = (bool)in_stack_00000038;
  local_88.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = height;
  local_8c = width;
  local_20 = animation;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_88,0xb);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
             (char (*) [8])0x25c0ca,(long *)&local_20);
  if (*(int *)this_00 >> 0x1f == *(int *)this_00) {
    pnVar6 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::shared_ptr<TgBot::InputFile>const>>
                       (this_00,(get_visitor<const_std::shared_ptr<TgBot::InputFile>_> *)&local_68);
    if (pnVar6 == (result_type)0x0) {
      local_68.m_data._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_68);
    }
    peVar3 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_68.m_data._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[10],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [10])"animation",&peVar3->data,(bool *)&local_68,&peVar3->mimeType,
               &peVar3->fileName);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  else {
    pnVar7 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::__cxx11::string_const>>
                       (this_00,(get_visitor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_68);
    if (pnVar7 == (result_type)0x0) {
      local_68.m_data._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_68);
    }
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[10],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [10])"animation",pnVar7);
  }
  if (local_8c != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[9],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [9])0x25c43e,&local_8c);
  }
  if (local_90 != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [6])0x25c425,&local_90);
  }
  if ((int)thumb != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[7],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [7])0x25c431,(int *)&thumb);
  }
  iVar2 = *(int *)&(caption->_M_dataplus)._M_p;
  if (iVar2 >> 0x1f == iVar2) {
    pnVar6 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::shared_ptr<TgBot::InputFile>const>>
                       ((variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *)caption,
                        (get_visitor<const_std::shared_ptr<TgBot::InputFile>_> *)&local_68);
    if (pnVar6 == (result_type)0x0) {
      local_68.m_data._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_68);
    }
    peVar3 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (pnVar6->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    local_68.m_data._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[6],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [6])"thumb",&peVar3->data,(bool *)&local_68,&peVar3->mimeType,
               &peVar3->fileName);
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  else {
    pnVar7 = boost::variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string>::
             apply_visitor<boost::detail::variant::get_visitor<std::__cxx11::string_const>>
                       ((variant<std::shared_ptr<TgBot::InputFile>,std::__cxx11::string> *)caption,
                        (get_visitor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_40);
    if (pnVar7 == (result_type)0x0) {
      local_40._M_dataplus._M_p = (pointer)&PTR__exception_002a4da0;
      boost::throw_exception<boost::bad_get>((bad_get *)&local_40);
    }
    paVar1 = &local_68.m_data.field_2;
    pcVar5 = (pnVar7->_M_dataplus)._M_p;
    local_68.m_data._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar5,pcVar5 + pnVar7->_M_string_length);
    if (local_68.m_data._M_string_length != 0) {
      std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
      emplace_back<char_const(&)[6],std::__cxx11::string&>
                ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
                 (char (*) [6])"thumb",&local_68.m_data);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_data._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.m_data._M_dataplus._M_p);
    }
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(in_stack_0000001c,replyToMessageId))->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[8],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [8])"caption",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_0000001c,replyToMessageId));
  }
  if ((int)replyMarkup != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [20])"reply_to_message_id",(int *)&replyMarkup);
  }
  if ((parseMode->_M_dataplus)._M_p != (pointer)0x0) {
    TgTypeParser::parseGenericReply_abi_cxx11_
              (&local_68.m_data,(TgTypeParser *)(chatId + 0x28),(Ptr *)parseMode);
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[13],std::__cxx11::string>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [13])"reply_markup",&local_68.m_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_data._M_dataplus._M_p != &local_68.m_data.field_2) {
      operator_delete(local_68.m_data._M_dataplus._M_p);
    }
  }
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT71(in_stack_00000031,disableNotification))->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [11])"parse_mode",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_stack_00000031,disableNotification));
  }
  if (local_91 == true) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[21],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_88,
               (char (*) [21])"disable_notification",&local_91);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sendAnimation","");
  sendRequest(&local_68,(Api *)chatId,&local_40,&local_88);
  TgTypeParser::parseJsonAndGetMessage((TgTypeParser *)this,(ptree *)(chatId + 0x28));
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_88);
  PVar8.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar8.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar8.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr Api::sendAnimation(int64_t chatId, const boost::variant<InputFile::Ptr, std::string> animation, int32_t duration, int32_t width, int32_t height, const boost::variant<InputFile::Ptr, std::string> thumb, const string& caption, int32_t replyToMessageId, GenericReply::Ptr replyMarkup, const string& parseMode, bool disableNotification) const {
    vector<HttpReqArg> args;
    args.reserve(11);
    args.emplace_back("chat_id", chatId);
    if (animation.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(animation);
        args.emplace_back("animation", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        args.emplace_back("animation", boost::get<std::string>(animation));
    }
    if (duration) {
        args.emplace_back("duration", duration);
    }
    if (width) {
        args.emplace_back("width", width);
    }
    if (height) {
        args.emplace_back("height", height);
    }
    if (thumb.which() == 0 /* InputFile::Ptr */) {
        auto file = boost::get<InputFile::Ptr>(thumb);
        args.emplace_back("thumb", file->data, true, file->mimeType, file->fileName);
    } else /* std::string */ {
        auto thumbStr = boost::get<std::string>(thumb);
        if (!thumbStr.empty()) {
            args.emplace_back("thumb", thumbStr);
        }
    }
    if (!caption.empty()) {
        args.emplace_back("caption", caption);
    }
    if (replyToMessageId) {
        args.emplace_back("reply_to_message_id", replyToMessageId);
    }
    if (replyMarkup) {
        args.emplace_back("reply_markup", _tgTypeParser.parseGenericReply(replyMarkup));
    }
    if (!parseMode.empty()) {
        args.emplace_back("parse_mode", parseMode);
    }
    if (disableNotification){
        args.emplace_back("disable_notification", disableNotification);
    }
    return _tgTypeParser.parseJsonAndGetMessage(sendRequest("sendAnimation", args));
}